

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O1

void __thiscall
RGBUnboundedSpectrum_MaxValue_Test::TestBody(RGBUnboundedSpectrum_MaxValue_Test *this)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined8 *puVar5;
  undefined8 *puVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  byte bVar11;
  uint64_t oldstate_1;
  ulong uVar12;
  ulong uVar13;
  char *message;
  int iVar14;
  uint64_t oldstate;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  float fVar24;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM5_Qb;
  RGBUnboundedSpectrum rs;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  float local_270;
  float local_26c;
  Float local_268;
  float local_264;
  uint local_260;
  float local_25c;
  RGBUnboundedSpectrum local_258;
  string local_248;
  internal local_228 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  long local_218;
  RGBColorSpace *local_210;
  RGB local_208;
  RGBColorSpace local_1f8;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_138;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_a0;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 auStack_70 [64];
  
  puVar5 = pbrt::RGBColorSpace::sRGB;
  local_1f8.r.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)*pbrt::RGBColorSpace::sRGB;
  local_1f8.g.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)pbrt::RGBColorSpace::sRGB[1];
  local_1f8.b.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)pbrt::RGBColorSpace::sRGB[2];
  local_1f8.w.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)pbrt::RGBColorSpace::sRGB[3];
  local_1f8.illuminant._0_8_ = pbrt::RGBColorSpace::sRGB[4];
  pvVar1 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
           (pbrt::RGBColorSpace::sRGB + 5);
  local_248._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)((long)&local_1f8 + 0x28),
             pvVar1,(polymorphic_allocator<float> *)&local_248);
  puVar6 = pbrt::RGBColorSpace::Rec2020;
  local_1f8.XYZFromRGB.m[0]._0_8_ = puVar5[9];
  local_1f8.XYZFromRGB.m._8_8_ = puVar5[10];
  local_1f8.XYZFromRGB.m[1]._4_8_ = puVar5[0xb];
  local_1f8.XYZFromRGB.m[2]._0_8_ = puVar5[0xc];
  local_1f8._104_8_ = puVar5[0xd];
  local_1f8.RGBFromXYZ.m[0]._4_8_ = puVar5[0xe];
  local_1f8.RGBFromXYZ.m[1]._0_8_ = puVar5[0xf];
  local_1f8.RGBFromXYZ.m._20_8_ = puVar5[0x10];
  local_1f8.RGBFromXYZ.m[2]._4_8_ = puVar5[0x11];
  local_1f8.rgbToSpectrumTable = (RGBToSpectrumTable *)puVar5[0x12];
  local_160 = *pbrt::RGBColorSpace::Rec2020;
  uStack_158 = pbrt::RGBColorSpace::Rec2020[1];
  uStack_150 = pbrt::RGBColorSpace::Rec2020[2];
  uStack_148 = pbrt::RGBColorSpace::Rec2020[3];
  local_140 = pbrt::RGBColorSpace::Rec2020[4];
  pvVar1 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
           (pbrt::RGBColorSpace::Rec2020 + 5);
  local_248._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_138,pvVar1,(polymorphic_allocator<float> *)&local_248);
  puVar5 = pbrt::RGBColorSpace::ACES2065_1;
  uStack_118 = puVar6[9];
  uStack_110 = puVar6[10];
  local_108 = puVar6[0xb];
  uStack_100 = puVar6[0xc];
  uStack_f8 = puVar6[0xd];
  uStack_f0 = puVar6[0xe];
  uStack_e8 = puVar6[0xf];
  uStack_e0 = puVar6[0x10];
  uStack_d8 = puVar6[0x11];
  uStack_d0 = puVar6[0x12];
  local_c8 = *pbrt::RGBColorSpace::ACES2065_1;
  uStack_c0 = pbrt::RGBColorSpace::ACES2065_1[1];
  uStack_b8 = pbrt::RGBColorSpace::ACES2065_1[2];
  uStack_b0 = pbrt::RGBColorSpace::ACES2065_1[3];
  local_a8 = pbrt::RGBColorSpace::ACES2065_1[4];
  pvVar1 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
           (pbrt::RGBColorSpace::ACES2065_1 + 5);
  local_248._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_a0,pvVar1,(polymorphic_allocator<float> *)&local_248);
  local_80 = puVar5[9];
  uStack_78 = puVar5[10];
  auStack_70 = *(undefined1 (*) [64])(puVar5 + 0xb);
  uVar15 = 0x853c49e6748fea9b;
  lVar10 = 0;
  do {
    local_210 = (RGBColorSpace *)((long)&local_1f8 + lVar10);
    iVar14 = 0;
    local_218 = lVar10;
    do {
      uVar12 = uVar15 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      uVar13 = uVar12 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      uVar9 = (uint)(uVar13 >> 0x2d) ^ (uint)(uVar13 >> 0x1b);
      bVar11 = (byte)(uVar13 >> 0x3b);
      auVar17._8_8_ = in_XMM5_Qb;
      auVar17._0_8_ = in_XMM5_Qa;
      auVar17 = vcvtusi2ss_avx512f(auVar17,uVar9 >> bVar11 | uVar9 << 0x20 - bVar11);
      auVar17 = vminss_avx(ZEXT416((uint)(auVar17._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar12;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar15;
      auVar20 = vpunpcklqdq_avx(auVar22,auVar19);
      auVar16 = vpsrlvq_avx2(auVar20,_DAT_005655c0);
      auVar2 = vpsrlvq_avx2(auVar20,_DAT_005655d0);
      auVar16 = vpshufd_avx(auVar16 ^ auVar2,0xe8);
      auVar20 = vpsrlq_avx(auVar20,0x3b);
      auVar20 = vpshufd_avx(auVar20,0xe8);
      auVar16 = vprorvd_avx512vl(auVar16,auVar20);
      auVar20 = vcvtudq2ps_avx512vl(auVar16);
      auVar16._8_4_ = 0x2f800000;
      auVar16._0_8_ = 0x2f8000002f800000;
      auVar16._12_4_ = 0x2f800000;
      auVar16 = vmulps_avx512vl(auVar20,auVar16);
      auVar20._8_4_ = 0x3f7fffff;
      auVar20._0_8_ = 0x3f7fffff3f7fffff;
      auVar20._12_4_ = 0x3f7fffff;
      auVar16 = vminps_avx512vl(auVar16,auVar20);
      auVar2._8_4_ = 0x41200000;
      auVar2._0_8_ = 0x4120000041200000;
      auVar2._12_4_ = 0x41200000;
      auVar16 = vmulps_avx512vl(auVar16,auVar2);
      local_208._0_8_ = vmovlps_avx(auVar16);
      local_208.b = auVar17._0_4_ * 10.0;
      pbrt::RGBUnboundedSpectrum::RGBUnboundedSpectrum(&local_258,local_210,&local_208);
      local_264 = local_258.scale;
      local_268 = pbrt::RGBSigmoidPolynomial::MaxValue(&local_258.rsp);
      uVar15 = uVar13 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      auVar17 = ZEXT816(0) << 0x40;
      auVar23 = ZEXT464(0x43b40000);
      do {
        auVar16 = vfmadd213ss_fma(ZEXT416((uint)local_258.rsp.c0),auVar23._0_16_,
                                  ZEXT416((uint)local_258.rsp.c1));
        auVar16 = vfmadd213ss_fma(auVar16,auVar23._0_16_,ZEXT416((uint)local_258.rsp.c2));
        fVar24 = local_258.scale;
        if ((auVar16._0_4_ & 0x7fffffff) == 0x7f800000) {
          uVar3 = vcmpss_avx512f(auVar16,ZEXT416(0),0xe);
          fVar18 = (float)((uint)((byte)uVar3 & 1) * 0x3f800000);
        }
        else {
          auVar20 = vfmadd213ss_fma(auVar16,auVar16,ZEXT416(0x3f800000));
          if (auVar20._0_4_ < 0.0) {
            local_26c = auVar17._0_4_;
            local_270 = auVar23._0_4_;
            local_25c = local_258.scale;
            local_260 = auVar16._0_4_;
            fVar18 = sqrtf(auVar20._0_4_);
            auVar16 = ZEXT416(local_260);
            auVar23 = ZEXT464((uint)local_270);
            auVar17 = ZEXT416((uint)local_26c);
            fVar24 = local_25c;
          }
          else {
            auVar20 = vsqrtss_avx(auVar20,auVar20);
            fVar18 = auVar20._0_4_;
          }
          fVar18 = auVar16._0_4_ / (fVar18 + fVar18) + 0.5;
        }
        auVar17 = vmaxss_avx(ZEXT416((uint)(fVar24 * fVar18)),auVar17);
        fVar24 = auVar23._0_4_ + 0.0625;
        auVar23 = ZEXT464((uint)fVar24);
      } while (fVar24 <= 830.0);
      local_270 = local_268 * local_264;
      local_26c = auVar17._0_4_;
      auVar21._0_4_ = (local_26c - local_270) / local_26c;
      auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx512vl(auVar21,auVar4);
      local_278.ptr_._0_4_ = auVar17._0_4_;
      local_248._M_dataplus._M_p = &DAT_3f1a36e2eb1c432d;
      testing::internal::CmpHelperLT<float,double>
                (local_228,"std::abs((sm - m) / sm)","1e-4",(float *)&local_278,(double *)&local_248
                );
      if (local_228[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_278.ptr_ + 0x10),"sampled ",8);
        std::ostream::_M_insert<double>((double)local_26c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_278.ptr_ + 0x10)," MaxValue ",10);
        std::ostream::_M_insert<double>((double)local_270);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_278.ptr_ + 0x10)," for ",5);
        sVar7.ptr_ = local_278.ptr_;
        pbrt::RGBUnboundedSpectrum::ToString_abi_cxx11_(&local_248,&local_258);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(sVar7.ptr_ + 0x10),local_248._M_dataplus._M_p,
                   local_248._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        message = "";
        if (local_220.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_220.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_248,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
                   ,0x68,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)&local_278)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
        if (local_278.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar8 = testing::internal::IsTrue(true);
          if ((bVar8) &&
             (local_278.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_278.ptr_ + 8))();
          }
          local_278.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar14 = iVar14 + 1;
    } while (iVar14 != 100);
    lVar10 = local_218 + 0x98;
  } while (lVar10 != 0x1c8);
  lVar10 = 0x158;
  do {
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               ((long)&local_1f8 + lVar10));
    lVar10 = lVar10 + -0x98;
  } while (lVar10 != -0x70);
  return;
}

Assistant:

TEST(RGBUnboundedSpectrum, MaxValue) {
    RNG rng;
    for (const auto &cs :
         {*RGBColorSpace::sRGB, *RGBColorSpace::Rec2020, *RGBColorSpace::ACES2065_1}) {
        for (int i = 0; i < 100; ++i) {
            RGB rgb(rng.Uniform<Float>(), rng.Uniform<Float>(), rng.Uniform<Float>());
            rgb *= 10.f;
            RGBUnboundedSpectrum rs(cs, rgb);

            Float m = rs.MaxValue();
            Float sm = 0;
            for (Float lambda = 360; lambda <= 830; lambda += 1. / 16.)
                sm = std::max(sm, rs(lambda));
            EXPECT_LT(std::abs((sm - m) / sm), 1e-4)
                << "sampled " << sm << " MaxValue " << m << " for " << rs;
        }
    }
}